

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.cpp
# Opt level: O2

void InsertSort(int *A,int n)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 1;
  do {
    if (n <= lVar2) {
      return;
    }
    iVar1 = A[lVar2];
    for (lVar3 = lVar2; 0 < lVar3; lVar3 = lVar3 + -1) {
      if (A[lVar3 + -1] <= iVar1) goto LAB_00101553;
      A[lVar3] = A[lVar3 + -1];
    }
    lVar3 = 0;
LAB_00101553:
    A[(int)lVar3] = iVar1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void InsertSort(int A[], int n) {
    int j,temp;
    for(int i = 1; i < n; ++i) {
        temp = A[i];  //将待插入关键字暂存于temp中
        j = i-1;
        //下面这个while循环完成了从待排序关键字之前的关键字扫描，如果大于待排关键字则后移一位
        while(j>=0 && temp<A[j]) {
            A[j+1] = A[j];
            --j;
        }
        A[j+1] = temp;   //找到插入位置就插入
    }
}